

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.h
# Opt level: O0

void __thiscall
btBvhSubtreeInfo::setAabbFromQuantizeNode(btBvhSubtreeInfo *this,btQuantizedBvhNode *quantizedNode)

{
  btQuantizedBvhNode *quantizedNode_local;
  btBvhSubtreeInfo *this_local;
  
  this->m_quantizedAabbMin[0] = quantizedNode->m_quantizedAabbMin[0];
  this->m_quantizedAabbMin[1] = quantizedNode->m_quantizedAabbMin[1];
  this->m_quantizedAabbMin[2] = quantizedNode->m_quantizedAabbMin[2];
  this->m_quantizedAabbMax[0] = quantizedNode->m_quantizedAabbMax[0];
  this->m_quantizedAabbMax[1] = quantizedNode->m_quantizedAabbMax[1];
  this->m_quantizedAabbMax[2] = quantizedNode->m_quantizedAabbMax[2];
  return;
}

Assistant:

void	setAabbFromQuantizeNode(const btQuantizedBvhNode& quantizedNode)
	{
		m_quantizedAabbMin[0] = quantizedNode.m_quantizedAabbMin[0];
		m_quantizedAabbMin[1] = quantizedNode.m_quantizedAabbMin[1];
		m_quantizedAabbMin[2] = quantizedNode.m_quantizedAabbMin[2];
		m_quantizedAabbMax[0] = quantizedNode.m_quantizedAabbMax[0];
		m_quantizedAabbMax[1] = quantizedNode.m_quantizedAabbMax[1];
		m_quantizedAabbMax[2] = quantizedNode.m_quantizedAabbMax[2];
	}